

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shop::printSale(Shop *this,Sale *sale)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  undefined1 local_a8 [8];
  Medicine medicine;
  Sale *sale_local;
  Shop *this_local;
  
  medicine._136_8_ = sale;
  poVar2 = std::operator<<((ostream *)&std::cout,"ID");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Customer Name");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Medicine Name");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Medicine Company");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Quantity");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Unit Price");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Total Amount");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Date");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Medicine::Medicine((Medicine *)local_a8,&sale->medicine);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sale->id);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,(string *)&sale->customerName);
  poVar2 = std::operator<<(poVar2,"\t");
  psVar3 = Medicine::getName_abi_cxx11_((Medicine *)local_a8);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  psVar3 = Medicine::getCompanyName_abi_cxx11_((Medicine *)local_a8);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sale->quantity);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a8._4_4_);
  poVar2 = std::operator<<(poVar2,"\t");
  iVar1 = Sale::getTotalAmount(sale);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"\t");
  psVar3 = Sale::getDate_abi_cxx11_(sale);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Medicine::~Medicine((Medicine *)local_a8);
  return;
}

Assistant:

void printSale(Sale sale) {
        cout << "ID" << "\t" << "Customer Name" << "\t" << "Medicine Name" << "\t" << "Medicine Company" << "\t"
             << "Quantity" << "\t" << "Unit Price" << "\t" << "Total Amount" << "\t" << "Date" << endl;
        Medicine medicine = sale.medicine;
        cout << sale.id << "\t" << sale.customerName << "\t" << medicine.getName() << "\t" << medicine.getCompanyName()
             << "\t" << sale.quantity << "\t" << medicine.unitePrice << "\t" << sale.getTotalAmount() << "\t"
             << sale.getDate() << endl;
    }